

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_3dfloors.cpp
# Opt level: O2

void P_Recalculate3DFloors(sector_t_conflict *sector)

{
  xfloor *other;
  DVector2 *pDVar1;
  byte *pbVar2;
  TArray<lightlist_t,_lightlist_t> *this;
  extsector_t *peVar3;
  lightlist_t *plVar4;
  secplane_t *psVar5;
  FTextureID *pFVar6;
  sector_t *psVar7;
  undefined7 uVar8;
  int iVar9;
  int iVar10;
  short *psVar11;
  anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0 aVar12;
  F3DFloor *pFVar13;
  F3DFloor *__dest;
  F3DFloor *pFVar14;
  FDynamicColormap *pFVar15;
  uint uVar16;
  uint uVar17;
  F3DFloor *pFVar18;
  ulong uVar19;
  ulong uVar20;
  double dVar21;
  F3DFloor *pick;
  double local_f8;
  double local_f0;
  F3DFloor *dyn;
  undefined8 local_e0;
  TArray<F3DFloor_*,_F3DFloor_*> oldlist;
  short *local_c8;
  FDynamicColormap *pFStack_c0;
  lightlist_t local_98;
  short *local_48;
  undefined8 uStack_40;
  
  peVar3 = sector->e;
  other = &peVar3->XFloor;
  uVar17 = (peVar3->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
  if (1 < uVar17) {
    oldlist.Array = (F3DFloor **)0x0;
    oldlist.Most = 0;
    oldlist.Count = 0;
    TArray<F3DFloor_*,_F3DFloor_*>::operator=(&oldlist,(TArray<F3DFloor_*,_F3DFloor_*> *)other);
    TArray<F3DFloor_*,_F3DFloor_*>::Clear((TArray<F3DFloor_*,_F3DFloor_*> *)other);
    uVar17 = 0;
    do {
LAB_003c0cda:
      if (oldlist.Count <= uVar17) {
        pDVar1 = &sector->centerspot;
        local_e0 = 0.0;
        pFVar13 = (F3DFloor *)0x0;
        local_c8 = (short *)0x0;
        pFVar18 = (F3DFloor *)0x0;
        while (oldlist.Count != 0) {
          pick = *oldlist.Array;
          local_f0 = secplane_t::ZatPoint((pick->top).plane,pDVar1);
          uVar20 = 0;
          for (uVar19 = 1; uVar19 < (ulong)oldlist._8_8_ >> 0x20; uVar19 = uVar19 + 1) {
            dVar21 = secplane_t::ZatPoint((oldlist.Array[uVar19]->top).plane,pDVar1);
            if (local_f0 < dVar21) {
              pick = oldlist.Array[uVar19];
              uVar20 = uVar19 & 0xffffffff;
              local_f0 = dVar21;
            }
          }
          TArray<F3DFloor_*,_F3DFloor_*>::Delete(&oldlist,(uint)uVar20);
          local_f8 = secplane_t::ZatPoint((pick->bottom).plane,pDVar1);
          pFVar14 = pick;
          uVar17 = pick->flags;
          if ((uVar17 >> 0x1e & 1) == 0) {
            if (((uVar17 & 1) == 0) || ((uVar17 & 0x810) == 0 && (uVar17 & 0xc) != 0)) {
              if ((pFVar18 == (F3DFloor *)0x0) || (local_f0 <= local_e0)) {
                psVar11 = local_c8;
                if (local_f8 < (double)local_c8 || pFVar13 == (F3DFloor *)0x0) {
                  pFVar13 = pick;
                  psVar11 = (short *)local_f8;
                }
                local_f8 = (double)psVar11;
                TArray<F3DFloor_*,_F3DFloor_*>::Push((TArray<F3DFloor_*,_F3DFloor_*> *)other,&pick);
                local_c8 = (short *)local_f8;
                pFVar18 = (F3DFloor *)0x0;
              }
              else {
                pFVar13 = (F3DFloor *)operator_new(0x98);
                dyn = pFVar13;
                memcpy(pFVar13,pFVar18,0x98);
                pFVar18->flags = pFVar18->flags & 0xfefffffe | 0x1000000;
                pbVar2 = (byte *)((long)&pFVar13->flags + 2);
                *pbVar2 = *pbVar2 | 0x80;
                uVar8 = *(undefined7 *)&(pFVar14->top).field_0x21;
                (pFVar13->bottom).copied = (pFVar14->top).copied;
                *(undefined7 *)&(pFVar13->bottom).field_0x21 = uVar8;
                pFVar6 = (pFVar14->top).texture;
                psVar7 = (pFVar14->top).model;
                iVar9 = (pFVar14->top).isceiling;
                iVar10 = (pFVar14->top).vindex;
                (pFVar13->bottom).plane = (pFVar14->top).plane;
                (pFVar13->bottom).texture = pFVar6;
                (pFVar13->bottom).model = psVar7;
                (pFVar13->bottom).isceiling = iVar9;
                (pFVar13->bottom).vindex = iVar10;
                (pFVar13->bottom).copied = true;
                TArray<F3DFloor_*,_F3DFloor_*>::Push((TArray<F3DFloor_*,_F3DFloor_*> *)other,&dyn);
                TArray<F3DFloor_*,_F3DFloor_*>::Push((TArray<F3DFloor_*,_F3DFloor_*> *)other,&pick);
                if (local_f8 <= local_e0) {
                  pFVar18 = (F3DFloor *)0x0;
                }
                else {
                  pFVar13 = (F3DFloor *)operator_new(0x98);
                  dyn = pFVar13;
                  memcpy(pFVar13,pFVar18,0x98);
                  pFVar13->flags = pFVar13->flags | 0x800001;
                  uVar8 = *(undefined7 *)&(pick->bottom).field_0x21;
                  (pFVar13->top).copied = (pick->bottom).copied;
                  *(undefined7 *)&(pFVar13->top).field_0x21 = uVar8;
                  pFVar6 = (pick->bottom).texture;
                  psVar7 = (pick->bottom).model;
                  iVar9 = (pick->bottom).isceiling;
                  iVar10 = (pick->bottom).vindex;
                  (pFVar13->top).plane = (pick->bottom).plane;
                  (pFVar13->top).texture = pFVar6;
                  (pFVar13->top).model = psVar7;
                  (pFVar13->top).isceiling = iVar9;
                  (pFVar13->top).vindex = iVar10;
                  (pFVar13->top).copied = true;
                  TArray<F3DFloor_*,_F3DFloor_*>::Push((TArray<F3DFloor_*,_F3DFloor_*> *)other,&dyn)
                  ;
                  pFVar18 = dyn;
                }
                local_c8 = (short *)local_f8;
                pFVar13 = pick;
              }
            }
            else if ((pFVar13 == (F3DFloor *)0x0) || (local_f0 <= (double)local_c8)) {
              if (local_f8 <= local_f0) {
                TArray<F3DFloor_*,_F3DFloor_*>::Push((TArray<F3DFloor_*,_F3DFloor_*> *)other,&pick);
                local_e0 = local_f8;
                pFVar18 = pFVar14;
              }
              else {
                __dest = (F3DFloor *)operator_new(0x98);
                dyn = __dest;
                memcpy(__dest,pFVar14,0x98);
                pFVar14->flags = pFVar14->flags & 0xfefffffe | 0x1000000;
                pbVar2 = (byte *)((long)&__dest->flags + 2);
                *pbVar2 = *pbVar2 | 0x80;
                uVar8 = *(undefined7 *)&(pFVar14->top).field_0x21;
                (__dest->bottom).copied = (pFVar14->top).copied;
                *(undefined7 *)&(__dest->bottom).field_0x21 = uVar8;
                pFVar6 = (pFVar14->top).texture;
                psVar7 = (pFVar14->top).model;
                iVar9 = (pFVar14->top).isceiling;
                iVar10 = (pFVar14->top).vindex;
                (__dest->bottom).plane = (pFVar14->top).plane;
                (__dest->bottom).texture = pFVar6;
                (__dest->bottom).model = psVar7;
                (__dest->bottom).isceiling = iVar9;
                (__dest->bottom).vindex = iVar10;
                (__dest->bottom).copied = true;
                TArray<F3DFloor_*,_F3DFloor_*>::Push((TArray<F3DFloor_*,_F3DFloor_*> *)other,&pick);
                TArray<F3DFloor_*,_F3DFloor_*>::Push((TArray<F3DFloor_*,_F3DFloor_*> *)other,&dyn);
              }
            }
            else {
              TArray<F3DFloor_*,_F3DFloor_*>::Push((TArray<F3DFloor_*,_F3DFloor_*> *)other,&pick);
              if (local_f8 <= (double)local_c8) {
                pFVar14 = (F3DFloor *)operator_new(0x98);
                pFVar18 = pick;
                dyn = pFVar14;
                memcpy(pFVar14,pick,0x98);
                pFVar18->flags = pFVar18->flags & 0xfefffffe | 0x1000000;
                pbVar2 = (byte *)((long)&pFVar14->flags + 2);
                *pbVar2 = *pbVar2 | 0x80;
                uVar8 = *(undefined7 *)&(pFVar13->bottom).field_0x21;
                (pFVar14->top).copied = (pFVar13->bottom).copied;
                *(undefined7 *)&(pFVar14->top).field_0x21 = uVar8;
                pFVar6 = (pFVar13->bottom).texture;
                psVar7 = (pFVar13->bottom).model;
                iVar9 = (pFVar13->bottom).isceiling;
                iVar10 = (pFVar13->bottom).vindex;
                (pFVar14->top).plane = (pFVar13->bottom).plane;
                (pFVar14->top).texture = pFVar6;
                (pFVar14->top).model = psVar7;
                (pFVar14->top).isceiling = iVar9;
                (pFVar14->top).vindex = iVar10;
                (pFVar14->top).copied = true;
                TArray<F3DFloor_*,_F3DFloor_*>::Push((TArray<F3DFloor_*,_F3DFloor_*> *)other,&dyn);
                local_e0 = local_f8;
                pFVar18 = dyn;
              }
              else {
                pick->flags = pick->flags & 0xfefffffe | 0x1000000;
              }
            }
          }
          else {
            TArray<F3DFloor_*,_F3DFloor_*>::Push((TArray<F3DFloor_*,_F3DFloor_*> *)other,&pick);
          }
        }
        TArray<F3DFloor_*,_F3DFloor_*>::~TArray(&oldlist);
        uVar17 = (peVar3->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
        break;
      }
      pFVar18 = oldlist.Array[uVar17];
      uVar16 = pFVar18->flags;
      if ((uVar16 >> 0x17 & 1) != 0) goto code_r0x003c0cf4;
      if ((uVar16 >> 0x18 & 1) != 0) {
        pFVar18->flags = (uVar16 & 0xfe7ffffe) + 1;
      }
      uVar17 = uVar17 + 1;
    } while( true );
  }
  if (uVar17 != 0) {
    this = &(peVar3->XFloor).lightlist;
    TArray<lightlist_t,_lightlist_t>::Resize(this,1);
    plVar4 = (peVar3->XFloor).lightlist.Array;
    (plVar4->plane).normal.Z = (sector->ceilingplane).normal.Z;
    dVar21 = (sector->ceilingplane).normal.Y;
    (plVar4->plane).normal.X = (sector->ceilingplane).normal.X;
    (plVar4->plane).normal.Y = dVar21;
    dVar21 = (sector->ceilingplane).negiC;
    (plVar4->plane).D = (sector->ceilingplane).D;
    (plVar4->plane).negiC = dVar21;
    plVar4 = (peVar3->XFloor).lightlist.Array;
    plVar4->p_lightlevel = &sector->lightlevel;
    plVar4->lightsource = (F3DFloor *)0x0;
    plVar4->caster = (F3DFloor *)0x0;
    plVar4->extra_colormap = sector->ColorMap;
    (plVar4->blend).field_0.d = 0;
    plVar4 = (peVar3->XFloor).lightlist.Array;
    plVar4->flags = 0;
    local_c8 = plVar4->p_lightlevel;
    pFStack_c0 = plVar4->extra_colormap;
    local_e0 = (double)CONCAT44(local_e0._4_4_,(plVar4->blend).field_0.d);
    pFVar18 = plVar4->lightsource;
    pDVar1 = &sector->centerspot;
    local_f0 = secplane_t::ZatPoint(&sector->ceilingplane,pDVar1);
    local_f8 = secplane_t::ZatPoint(&sector->floorplane,pDVar1);
    uStack_40 = 0;
    local_48 = &sector->lightlevel;
    for (uVar19 = 0; uVar19 < (peVar3->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
        uVar19 = uVar19 + 1) {
      pFVar13 = (other->ffloors).super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar19];
      if ((pFVar13->flags & 0x21) == 1) {
        dVar21 = secplane_t::ZatPoint((pFVar13->top).plane,pDVar1);
        if (dVar21 < local_f8) {
          return;
        }
        if (local_f0 <= dVar21) {
          dVar21 = secplane_t::ZatPoint((pFVar13->bottom).plane,pDVar1);
          if (local_f0 <= dVar21) goto LAB_003c1334;
          plVar4 = this->Array;
          plVar4->p_lightlevel = pFVar13->toplightlevel;
          plVar4->caster = pFVar13;
          plVar4->lightsource = pFVar13;
          pFVar15 = F3DFloor::GetColormap(pFVar13);
          plVar4 = this->Array;
          plVar4->extra_colormap = pFVar15;
          aVar12 = (anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0)
                   F3DFloor::GetBlend(pFVar13);
          (plVar4->blend).field_0.field_0 = aVar12;
          uVar17 = pFVar13->flags;
          this->Array->flags = uVar17;
        }
        else {
          psVar5 = (pFVar13->top).plane;
          local_98.plane.normal.Z = (psVar5->normal).Z;
          local_98.plane.normal.X = (psVar5->normal).X;
          local_98.plane.normal.Y = (psVar5->normal).Y;
          local_98.plane.D = psVar5->D;
          local_98.plane.negiC = psVar5->negiC;
          local_98.p_lightlevel = pFVar13->toplightlevel;
          local_98.lightsource = pFVar13;
          local_98.caster = pFVar13;
          local_98.extra_colormap = F3DFloor::GetColormap(pFVar13);
          local_98.blend = F3DFloor::GetBlend(pFVar13);
          local_98.flags = pFVar13->flags;
          TArray<lightlist_t,_lightlist_t>::Push(this,&local_98);
LAB_003c1334:
          uVar17 = pFVar13->flags;
        }
        if ((uVar17 & 0x80010000) == 0) {
          plVar4 = (peVar3->XFloor).lightlist.Array;
          uVar16 = (peVar3->XFloor).lightlist.Count - 1;
          local_c8 = plVar4[uVar16].p_lightlevel;
          pFStack_c0 = (FDynamicColormap *)(&plVar4[uVar16].p_lightlevel)[1];
          local_e0 = (double)CONCAT44(local_e0._4_4_,plVar4[uVar16].blend.field_0.d);
          pFVar18 = plVar4[uVar16].lightsource;
        }
        else if ((int)uVar17 < 0) {
          pFStack_c0 = sector->ColorMap;
          local_c8 = local_48;
          pFVar18 = (F3DFloor *)0x0;
          local_e0 = (double)((ulong)local_e0._4_4_ << 0x20);
        }
        if ((((uVar17 >> 0x10 & 1) != 0) &&
            (dVar21 = secplane_t::ZatPoint((pFVar13->bottom).plane,pDVar1), dVar21 < local_f0)) &&
           (local_f8 < dVar21)) {
          psVar5 = (pFVar13->bottom).plane;
          local_98.plane.normal.Z = (psVar5->normal).Z;
          local_98.plane.normal.X = (psVar5->normal).X;
          local_98.plane.normal.Y = (psVar5->normal).Y;
          local_98.plane.D = psVar5->D;
          local_98.plane.negiC = psVar5->negiC;
          local_98.p_lightlevel = local_c8;
          local_98.extra_colormap = pFStack_c0;
          local_98.blend.field_0.d = (anon_union_4_2_12391d7c_for_PalEntry_0)(uint32)local_e0;
          local_98.flags = pFVar13->flags;
          local_98.lightsource = pFVar18;
          local_98.caster = pFVar13;
          TArray<lightlist_t,_lightlist_t>::Push(this,&local_98);
        }
      }
    }
  }
  return;
code_r0x003c0cf4:
  operator_delete(pFVar18,0x98);
  TArray<F3DFloor_*,_F3DFloor_*>::Delete(&oldlist,uVar17);
  goto LAB_003c0cda;
}

Assistant:

void P_Recalculate3DFloors(sector_t * sector)
{
	F3DFloor *		rover;
	F3DFloor *		pick;
	unsigned		pickindex;
	F3DFloor *		clipped=NULL;
	F3DFloor *		solid=NULL;
	double			solid_bottom=0;
	double			clipped_top;
	double			clipped_bottom=0;
	double			maxheight, minheight;
	unsigned		i, j;
	lightlist_t newlight;
	lightlist_t resetlight;	// what it goes back to after FF_DOUBLESHADOW

	TArray<F3DFloor*> & ffloors=sector->e->XFloor.ffloors;
	TArray<lightlist_t> & lightlist = sector->e->XFloor.lightlist;

	// Sort the floors top to bottom for quicker access here and later
	// Translucent and swimmable floors are split if they overlap with solid ones.
	if (ffloors.Size()>1)
	{
		TArray<F3DFloor*> oldlist;
		
		oldlist = ffloors;
		ffloors.Clear();

		// first delete the old dynamic stuff
		for(i=0;i<oldlist.Size();i++)
		{
			F3DFloor * rover=oldlist[i];

			if (rover->flags&FF_DYNAMIC)
			{
				delete rover;
				oldlist.Delete(i);
				i--;
				continue;
			}
			if (rover->flags&FF_CLIPPED)
			{
				rover->flags&=~FF_CLIPPED;
				rover->flags|=FF_EXISTS;
			}
		}

		while (oldlist.Size())
		{
			pick=oldlist[0];
			double height=pick->top.plane->ZatPoint(sector->centerspot);

			// find highest starting ffloor - intersections are not supported!
			pickindex=0;
			for (j=1;j<oldlist.Size();j++)
			{
				double h2=oldlist[j]->top.plane->ZatPoint(sector->centerspot);

				if (h2>height)
				{
					pick=oldlist[j];
					pickindex=j;
					height=h2;
				}
			}

			oldlist.Delete(pickindex);
			double pick_bottom=pick->bottom.plane->ZatPoint(sector->centerspot);

			if (pick->flags & FF_THISINSIDE)
			{
				// These have the floor higher than the ceiling and cannot be processed
				// by the clipping code below.
				ffloors.Push(pick);
			}
			else if ((pick->flags&(FF_SWIMMABLE|FF_TRANSLUCENT) || (!(pick->flags&FF_RENDERALL))) && pick->flags&FF_EXISTS)
			{
				// We must check if this nonsolid segment gets clipped from the top by another 3D floor
				if (solid != NULL && solid_bottom < height)
				{
					ffloors.Push(pick);
					if (solid_bottom < pick_bottom)
					{
						// this one is fully covered
						pick->flags|=FF_CLIPPED;
						pick->flags&=~FF_EXISTS;
					}
					else
					{
						F3DFloor * dyn=new F3DFloor;
						*dyn=*pick;
						pick->flags|=FF_CLIPPED;
						pick->flags&=~FF_EXISTS;
						dyn->flags|=FF_DYNAMIC;
						dyn->top.copyPlane(&solid->bottom);
						ffloors.Push(dyn);

						clipped = dyn;
						clipped_top = solid_bottom;
						clipped_bottom = pick_bottom;
					}
				}
				else if (pick_bottom > height)	// do not allow inverted planes
				{
					F3DFloor * dyn = new F3DFloor;
					*dyn = *pick;
					pick->flags |= FF_CLIPPED;
					pick->flags &= ~FF_EXISTS;
					dyn->flags |= FF_DYNAMIC;
					dyn->bottom.copyPlane(&pick->top);
					ffloors.Push(pick);
					ffloors.Push(dyn);
				}
				else
				{
					clipped = pick;
					clipped_top = height;
					clipped_bottom = pick_bottom;
					ffloors.Push(pick);
				}
			}
			else if (clipped && clipped_bottom<height)
			{
				// translucent floor above must be clipped to this one!
				F3DFloor * dyn=new F3DFloor;
				*dyn=*clipped;
				clipped->flags|=FF_CLIPPED;
				clipped->flags&=~FF_EXISTS;
				dyn->flags|=FF_DYNAMIC;
				dyn->bottom.copyPlane(&pick->top);
				ffloors.Push(dyn);
				ffloors.Push(pick);

				if (pick_bottom<=clipped_bottom)
				{
					clipped=NULL;
				}
				else
				{
					// the translucent part extends below the clipper
					dyn=new F3DFloor;
					*dyn=*clipped;
					dyn->flags|=FF_DYNAMIC|FF_EXISTS;
					dyn->top.copyPlane(&pick->bottom);
					ffloors.Push(dyn);
					clipped = dyn;
					clipped_top = pick_bottom;
				}
				solid = pick;
				solid_bottom = pick_bottom;
			}
			else
			{
				clipped = NULL;
				if (solid == NULL || solid_bottom > pick_bottom)
				{
					// only if this one is lower
					solid = pick;
					solid_bottom = pick_bottom;
				}
				ffloors.Push(pick);

			}

		}
	}

	// having the floors sorted makes this routine significantly simpler
	// Only some overlapping cases with FF_DOUBLESHADOW might create anomalies
	// but these are clearly undefined.
	if(ffloors.Size())
	{
		lightlist.Resize(1);
		lightlist[0].plane = sector->ceilingplane;
		lightlist[0].p_lightlevel = &sector->lightlevel;
		lightlist[0].caster = NULL;
		lightlist[0].lightsource = NULL;
		lightlist[0].extra_colormap = sector->ColorMap;
		lightlist[0].blend = 0;
		lightlist[0].flags = 0;

		resetlight = lightlist[0];

		maxheight = sector->ceilingplane.ZatPoint(sector->centerspot);
		minheight = sector->floorplane.ZatPoint(sector->centerspot);
		for(i = 0; i < ffloors.Size(); i++)
		{
			rover=ffloors[i];

			if ( !(rover->flags & FF_EXISTS) || rover->flags & FF_NOSHADE )
				continue;
				
			double ff_top=rover->top.plane->ZatPoint(sector->centerspot);
			if (ff_top < minheight) break;	// reached the floor
			if (ff_top < maxheight)
			{
				newlight.plane = *rover->top.plane;
				newlight.p_lightlevel = rover->toplightlevel;
				newlight.caster = rover;
				newlight.lightsource = rover;
				newlight.extra_colormap = rover->GetColormap();
				newlight.blend = rover->GetBlend();
				newlight.flags = rover->flags;
				lightlist.Push(newlight);
			}
			else
			{
				double ff_bottom=rover->bottom.plane->ZatPoint(sector->centerspot);
				if (ff_bottom<maxheight)
				{
					// this segment begins over the ceiling and extends beyond it
					lightlist[0].p_lightlevel = rover->toplightlevel;
					lightlist[0].caster = rover;
					lightlist[0].lightsource = rover;
					lightlist[0].extra_colormap = rover->GetColormap();
					lightlist[0].blend = rover->GetBlend();
					lightlist[0].flags = rover->flags;
				}
			}
			if (!(rover->flags & (FF_DOUBLESHADOW | FF_RESET)))
			{
				resetlight = lightlist.Last();
			}
			else if (rover->flags & FF_RESET)
			{
				resetlight.p_lightlevel = &sector->lightlevel;
				resetlight.lightsource = NULL;
				resetlight.extra_colormap = sector->ColorMap;
				resetlight.blend = 0;
			}

			if (rover->flags&FF_DOUBLESHADOW)
			{
				double ff_bottom=rover->bottom.plane->ZatPoint(sector->centerspot);
				if(ff_bottom < maxheight && ff_bottom>minheight)
				{
					newlight.caster = rover;
					newlight.plane = *rover->bottom.plane;
					newlight.lightsource = resetlight.lightsource;
					newlight.p_lightlevel = resetlight.p_lightlevel;
					newlight.extra_colormap = resetlight.extra_colormap;
					newlight.blend = resetlight.blend;
					newlight.flags = rover->flags;
					lightlist.Push(newlight);
				}
			}
		}
	}
}